

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * make_GLSL_srcarg_string(Context *ctx,size_t idx,int writemask,char *buf,size_t buflen)

{
  RegisterType RVar1;
  uint uVar2;
  MOJOSHADER_shaderType shader_type;
  uint uVar3;
  VariableList *pVVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined1 auVar7 [4];
  int iVar8;
  int iVar9;
  uint *puVar10;
  uint *buf_00;
  size_t sVar11;
  char *pcVar12;
  uint uVar13;
  uint *puVar14;
  char *pcVar15;
  uint local_d8 [14];
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  char *local_90;
  char acStack_88 [8];
  char rel_offset [32];
  char local_60 [8];
  char swiz_str [6];
  undefined1 local_4c [4];
  char *pcStack_48;
  char rel_swizzle [4];
  char *local_40;
  
  puVar14 = (uint *)auStack_98;
  *buf = '\0';
  pcVar12 = "";
  puVar10 = &switchD_0011bfec::switchdataD_0012643c;
  switch(ctx->source_args[idx].src_mod) {
  case SRCMOD_NEGATE:
    local_40 = "-";
    goto LAB_0011c027;
  case SRCMOD_BIAS:
    local_40 = "(";
    goto LAB_0011c075;
  case SRCMOD_BIASNEGATE:
    local_40 = "-(";
LAB_0011c075:
    pcStack_48 = " - 0.5)";
    goto LAB_0011c0cb;
  case SRCMOD_SIGN:
    local_40 = "((";
    goto LAB_0011c052;
  case SRCMOD_SIGNNEGATE:
    local_40 = "-((";
LAB_0011c052:
    pcStack_48 = " - 0.5) * 2.0)";
    goto LAB_0011c0cb;
  case SRCMOD_COMPLEMENT:
    local_40 = "(1.0 - ";
    break;
  case SRCMOD_X2:
    local_40 = "(";
    goto LAB_0011c0a5;
  case SRCMOD_X2NEGATE:
    local_40 = "-(";
LAB_0011c0a5:
    pcStack_48 = " * 2.0)";
    goto LAB_0011c0cb;
  case SRCMOD_DZ:
    pcVar12 = "SRCMOD_DZ unsupported";
    goto LAB_0011c1fd;
  case SRCMOD_DW:
    pcVar12 = "SRCMOD_DW unsupported";
LAB_0011c1fd:
    uStack_a0 = 0x11c202;
    fail(ctx,pcVar12);
    return buf;
  case SRCMOD_ABS:
    local_40 = "abs(";
    break;
  case SRCMOD_ABSNEGATE:
    local_40 = "-abs(";
    break;
  case SRCMOD_NOT:
    local_40 = "!";
LAB_0011c027:
    pcStack_48 = "";
    goto LAB_0011c0cb;
  default:
    pcStack_48 = "";
    local_40 = "";
    puVar10 = (uint *)buf;
    goto LAB_0011c0cb;
  }
  pcStack_48 = ")";
LAB_0011c0cb:
  local_90 = buf;
  _swiz_str = ctx;
  if (ctx->source_args[idx].relative == 0) {
    buf_00 = local_d8;
    puVar10 = buf_00;
    get_GLSL_varname_in_buf
              (ctx,ctx->source_args[idx].regtype,ctx->source_args[idx].regnum,(char *)buf_00,
               0x1250a0);
    rel_offset[8] = '\0';
    rel_offset[9] = '\0';
    rel_offset[10] = '\0';
    rel_offset[0xb] = '\0';
    rel_offset[0xc] = '\0';
    rel_offset[0xd] = '\0';
    rel_offset[0xe] = '\0';
    rel_offset[0xf] = '\0';
    rel_offset[0x10] = '\0';
    rel_offset[0x11] = '\0';
    rel_offset[0x12] = '\0';
    rel_offset[0x13] = '\0';
    rel_offset[0x14] = '\0';
    rel_offset[0x15] = '\0';
    rel_offset[0x16] = '\0';
    rel_offset[0x17] = '\0';
    acStack_88[0] = '\0';
    acStack_88[1] = '\0';
    acStack_88[2] = '\0';
    acStack_88[3] = '\0';
    acStack_88[4] = '\0';
    acStack_88[5] = '\0';
    acStack_88[6] = '\0';
    acStack_88[7] = '\0';
    rel_offset[0] = '\0';
    rel_offset[1] = '\0';
    rel_offset[2] = '\0';
    rel_offset[3] = '\0';
    rel_offset[4] = '\0';
    rel_offset[5] = '\0';
    rel_offset[6] = '\0';
    rel_offset[7] = '\0';
    local_4c = (undefined1  [4])0x0;
    puVar14 = buf_00;
    if (ctx->source_args[idx].relative == 0) {
      pcVar12 = "";
      pcVar15 = "";
      puVar14 = (uint *)0x1250a0;
      puVar10 = buf_00;
      goto LAB_0011c269;
    }
  }
  local_4c = (undefined1  [4])0x0;
  rel_offset[0x10] = '\0';
  rel_offset[0x11] = '\0';
  rel_offset[0x12] = '\0';
  rel_offset[0x13] = '\0';
  rel_offset[0x14] = '\0';
  rel_offset[0x15] = '\0';
  rel_offset[0x16] = '\0';
  rel_offset[0x17] = '\0';
  rel_offset[8] = '\0';
  rel_offset[9] = '\0';
  rel_offset[10] = '\0';
  rel_offset[0xb] = '\0';
  rel_offset[0xc] = '\0';
  rel_offset[0xd] = '\0';
  rel_offset[0xe] = '\0';
  rel_offset[0xf] = '\0';
  rel_offset[0] = '\0';
  rel_offset[1] = '\0';
  rel_offset[2] = '\0';
  rel_offset[3] = '\0';
  rel_offset[4] = '\0';
  rel_offset[5] = '\0';
  rel_offset[6] = '\0';
  rel_offset[7] = '\0';
  acStack_88[0] = '\0';
  acStack_88[1] = '\0';
  acStack_88[2] = '\0';
  acStack_88[3] = '\0';
  acStack_88[4] = '\0';
  acStack_88[5] = '\0';
  acStack_88[6] = '\0';
  acStack_88[7] = '\0';
  RVar1 = ctx->source_args[idx].regtype;
  if (RVar1 == REG_TYPE_CONST) {
    pVVar4 = ctx->source_args[idx].relative_array;
    uVar3 = pVVar4->index;
    uVar2 = ctx->source_args[idx].regnum;
    uVar13 = uVar2 - uVar3;
    if ((int)uVar13 < 0) {
      *(code **)(puVar14 + -2) = make_GLSL_swizzle_string;
      __assert_fail("offset >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x823,
                    "const char *make_GLSL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                   );
    }
    if (pVVar4->constant == (ConstantsList *)0x0) {
      puVar14[-0x12] = 2;
      puVar14[-0x11] = 0;
      uVar5 = *(undefined8 *)(puVar14 + -0x12);
      puVar14[-0x12] = 0x11c1c8;
      puVar14[-0x11] = 0;
      get_GLSL_uniform_array_varname
                (_swiz_str,(RegisterType)uVar5,(char *)(puVar14 + -0x10),(size_t)puVar10);
      if (uVar2 == uVar3) {
        pcVar15 = "ARRAYBASE_%d + ";
        puVar14[-0x12] = 0x20;
        puVar14[-0x11] = 0;
        sVar11 = *(size_t *)(puVar14 + -0x12);
        goto LAB_0011c1de;
      }
      puVar14[-0x12] = 0x20;
      puVar14[-0x11] = 0;
      sVar11 = *(size_t *)(puVar14 + -0x12);
      pcVar12 = (char *)(ulong)uVar13;
      puVar14[-0x12] = 0x11c222;
      puVar14[-0x11] = 0;
      snprintf(acStack_88,sVar11,"(ARRAYBASE_%d + %d) + ",(ulong)uVar3);
    }
    else {
      iVar9 = pVVar4->count;
      puVar14[-0x12] = 0x11c197;
      puVar14[-0x11] = 0;
      get_GLSL_const_array_varname_in_buf
                (_swiz_str,uVar3,iVar9,(char *)(puVar14 + -0x10),(size_t)pcVar12);
      if (uVar2 != uVar3) {
        pcVar15 = "%d + ";
        puVar14[-0x12] = 0x20;
        puVar14[-0x11] = 0;
        sVar11 = *(size_t *)(puVar14 + -0x12);
        uVar3 = uVar13;
LAB_0011c1de:
        puVar14[-0x12] = 0x11c1e5;
        puVar14[-0x11] = 0;
        snprintf(acStack_88,sVar11,pcVar15,(ulong)uVar3);
      }
    }
  }
  else {
    if (RVar1 != REG_TYPE_INPUT) {
      puVar14[-2] = 0x11c308;
      puVar14[-1] = 0;
      __assert_fail("arg->regtype == REG_TYPE_CONST",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x820,
                    "const char *make_GLSL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                   );
    }
    *(undefined8 *)(puVar14 + -0x10) = 0x695f786574726576;
    *(undefined8 *)(puVar14 + -0xe) = 0x7272615f7475706e;
    *(undefined4 *)((long)puVar14 + -0x31) = 0x796172;
  }
  RVar1 = ctx->source_args[idx].relative_regtype;
  iVar9 = ctx->source_args[idx].relative_regnum;
  buf_00 = puVar14 + -0x20;
  puVar14[-0x22] = 0x11c23e;
  puVar14[-0x21] = 0;
  get_GLSL_varname_in_buf(_swiz_str,RVar1,iVar9,(char *)buf_00,(size_t)pcVar12);
  auVar7 = local_4c;
  local_4c[1] = "xyzw"[ctx->source_args[idx].relative_component];
  local_4c[0] = 0x2e;
  local_4c[3] = auVar7[3];
  local_4c[2] = 0;
  pcVar15 = "]";
  pcVar12 = "[";
  puVar10 = puVar14 + -0x10;
  puVar14 = buf_00;
LAB_0011c269:
  local_60[4] = '\0';
  local_60[5] = '\0';
  local_60[0] = '\0';
  local_60[1] = '\0';
  local_60[2] = '\0';
  local_60[3] = '\0';
  shader_type = _swiz_str->shader_type;
  iVar9 = ctx->source_args[idx].regnum;
  RVar1 = ctx->source_args[idx].regtype;
  buf_00[-2] = 0x11c283;
  buf_00[-1] = 0;
  iVar8 = isscalar(_swiz_str,shader_type,RVar1,iVar9);
  if (iVar8 == 0) {
    uVar3 = ctx->source_args[idx].swizzle;
    buf_00[-2] = 0x11c296;
    buf_00[-1] = 0;
    make_GLSL_swizzle_string(local_60,(ulong)uVar3,writemask,iVar9);
  }
  pcVar6 = local_90;
  buf_00[-2] = 0x40;
  buf_00[-1] = 0;
  sVar11 = *(size_t *)(buf_00 + -2);
  *(char **)(buf_00 + -2) = pcStack_48;
  *(char **)(buf_00 + -4) = local_60;
  *(char **)(buf_00 + -6) = pcVar15;
  *(undefined1 **)(buf_00 + -8) = local_4c;
  *(uint **)(buf_00 + -10) = puVar14;
  *(char **)(buf_00 + -0xc) = acStack_88;
  buf_00[-0xe] = 0x11c2d3;
  buf_00[-0xd] = 0;
  snprintf(local_90,sVar11,"%s%s%s%s%s%s%s%s%s",local_40,puVar10,pcVar12);
  return pcVar6;
}

Assistant:

static const char *make_GLSL_srcarg_string(Context *ctx, const size_t idx,
                                           const int writemask, char *buf,
                                           const size_t buflen)
{
    *buf = '\0';

    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (arg->src_mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_BIAS:
            premod_str = "(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_SIGN:
            premod_str = "((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_COMPLEMENT:
            premod_str = "(1.0 - ";
            postmod_str = ")";
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_X2:
            premod_str = "(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ unsupported"); return buf; // !!! FIXME
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW unsupported"); return buf; // !!! FIXME
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            premod_str = "-abs(";
            postmod_str = ")";
            break;

        case SRCMOD_ABS:
            premod_str = "abs(";
            postmod_str = ")";
            break;

        case SRCMOD_NOT:
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    const char *regtype_str = NULL;

    if (!arg->relative)
    {
        regtype_str = get_GLSL_varname_in_buf(ctx, arg->regtype, arg->regnum,
                                              (char *) alloca(64), 64);
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str=get_GLSL_input_array_varname(ctx,(char*)alloca(64),64);
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            if (arg->relative_array->constant)
            {
                const int arraysize = arg->relative_array->count;
                regtype_str = get_GLSL_const_array_varname_in_buf(ctx,
                                arrayidx, arraysize, (char *) alloca(64), 64);
                if (offset != 0)
                    snprintf(rel_offset, sizeof (rel_offset), "%d + ", offset);
            } // if
            else
            {
                regtype_str = get_GLSL_uniform_array_varname(ctx, arg->regtype,
                                                      (char *) alloca(64), 64);
                if (offset == 0)
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "ARRAYBASE_%d + ", arrayidx);
                } // if
                else
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "(ARRAYBASE_%d + %d) + ", arrayidx, offset);
                } // else
            } // else
        } // else

        rel_lbracket = "[";

        rel_regtype_str = get_GLSL_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);
        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';
        rel_rbracket = "]";
    } // if

    char swiz_str[6] = { '\0' };
    if (!isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum))
    {
        make_GLSL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 arg->swizzle, writemask);
    } // if

    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown source register type.");
        return buf;
    } // if

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s",
             premod_str, regtype_str, rel_lbracket, rel_offset,
             rel_regtype_str, rel_swizzle, rel_rbracket, swiz_str,
             postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}